

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O2

void __thiscall soul::Value::~Value(Value *this)

{
  ArrayWithPreallocation<unsigned_char,_8UL>::clear(&(this->allocatedData).allocatedData);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&(this->type).structure);
  return;
}

Assistant:

Value::~Value() = default;